

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::Test::RecordProperty(string *key,int value)

{
  string local_70;
  string local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Message value_message;
  
  Message::Message((Message *)&local_30);
  std::ostream::operator<<((ostream *)(local_30.ptr_ + 0x10),value);
  internal::StringStreamToString(&local_50,local_30.ptr_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             (allocator<char> *)((long)&value_message.ss_.ptr_ + 7));
  UnitTest::GetInstance();
  UnitTest::RecordProperty(&UnitTest::GetInstance::instance,key,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))(local_30.ptr_);
  }
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}